

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,FArrayBox *f)

{
  int iVar1;
  ostream *this;
  
  this = os;
  if (operator<<(std::ostream&,amrex::FArrayBox_const&)::fabio_ascii == '\0') {
    this = (ostream *)&operator<<(std::ostream&,amrex::FArrayBox_const&)::fabio_ascii;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      this = (ostream *)&operator<<(std::ostream&,amrex::FArrayBox_const&)::fabio_ascii;
      __cxa_guard_release();
    }
  }
  FABio_ascii::write((FABio_ascii *)this,(int)os,f,0);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&    os,
            const FArrayBox& f)
{
    static FABio_ascii fabio_ascii;
#ifdef AMREX_USE_GPU
    if (f.arena()->isManaged() || f.arena()->isDevice()) {
        FArrayBox hostfab(f.box(), f.nComp(), The_Pinned_Arena());
        Gpu::dtoh_memcpy_async(hostfab.dataPtr(), f.dataPtr(), f.size()*sizeof(Real));
        Gpu::streamSynchronize();
        fabio_ascii.write(os,hostfab,0,f.nComp());
    } else
#endif
    {
        fabio_ascii.write(os,f,0,f.nComp());
    }
    return os;
}